

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Induction.cpp
# Opt level: O0

void __thiscall
Inferences::InductionClauseIterator::processClause(InductionClauseIterator *this,Clause *premise)

{
  bool bVar1;
  uint uVar2;
  Clause *in_RSI;
  Clause *in_RDI;
  uint i;
  Literal *in_stack_00000340;
  Clause *in_stack_00000348;
  InductionClauseIterator *in_stack_00000350;
  Literal *in_stack_00001120;
  Clause *in_stack_00001128;
  InductionClauseIterator *in_stack_00001130;
  Clause *in_stack_ffffffffffffffc8;
  uint local_14;
  
  bVar1 = InductionHelper::isInductionClause(in_RDI);
  if (bVar1) {
    for (local_14 = 0; uVar2 = Kernel::Clause::length(in_RSI), local_14 < uVar2;
        local_14 = local_14 + 1) {
      Kernel::Clause::operator[](in_RSI,local_14);
      processLiteral(in_stack_00001130,in_stack_00001128,in_stack_00001120);
    }
  }
  bVar1 = InductionHelper::isIntInductionOneOn();
  if ((bVar1) && (bVar1 = InductionHelper::isIntegerComparison(in_stack_ffffffffffffffc8), bVar1)) {
    Kernel::Clause::operator[](in_RSI,0);
    processIntegerComparison(in_stack_00000350,in_stack_00000348,in_stack_00000340);
  }
  return;
}

Assistant:

void InductionClauseIterator::processClause(Clause* premise)
{
  // The premise should either contain a literal on which we want to apply induction,
  // or it should be an integer constant comparison we use as a bound.
  if (InductionHelper::isInductionClause(premise)) {
    for (unsigned i=0;i<premise->length();i++) {
      processLiteral(premise,(*premise)[i]);
    }
  }
  if (InductionHelper::isIntInductionOneOn() && InductionHelper::isIntegerComparison(premise)) {
    processIntegerComparison(premise, (*premise)[0]);
  }
}